

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O0

bool iDynTree::exportTransform(Transform *trans,xmlNodePtr parent_element)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 in_RSI;
  Vector3 pose_rpy;
  string pose_rpy_str;
  string pose_xyz_str;
  xmlNodePtr origin;
  bool ok;
  string *in_stack_00000128;
  VectorFixSize<3U> *in_stack_00000130;
  string *in_stack_00000148;
  Position *in_stack_00000150;
  bool local_a9;
  bool local_89;
  string local_70 [48];
  string local_40 [32];
  undefined8 local_20;
  bool local_11;
  
  local_11 = true;
  local_20 = xmlNewChild(in_RSI,0,"origin");
  std::__cxx11::string::string(local_40);
  local_89 = false;
  if ((local_11 & 1U) != 0) {
    iDynTree::Transform::getPosition();
    local_89 = vectorToString<iDynTree::Position>(in_stack_00000150,in_stack_00000148);
  }
  local_11 = local_89;
  std::__cxx11::string::string(local_70);
  iDynTree::Transform::getRotation();
  iDynTree::Rotation::asRPY();
  local_a9 = false;
  if ((local_11 & 1U) != 0) {
    local_a9 = vectorToString<iDynTree::VectorFixSize<3u>>(in_stack_00000130,in_stack_00000128);
  }
  uVar1 = local_20;
  local_11 = local_a9;
  uVar3 = std::__cxx11::string::c_str();
  xmlNewProp(uVar1,"xyz",uVar3);
  uVar1 = local_20;
  uVar3 = std::__cxx11::string::c_str();
  xmlNewProp(uVar1,"rpy",uVar3);
  bVar2 = local_11;
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_40);
  return (bool)(bVar2 & 1);
}

Assistant:

bool exportTransform(const Transform &trans, xmlNodePtr parent_element)
{
    bool ok = true;
    xmlNodePtr origin = xmlNewChild(parent_element, NULL, BAD_CAST "origin", NULL);
    std::string pose_xyz_str;
    ok = ok && vectorToString(trans.getPosition(), pose_xyz_str);
    std::string pose_rpy_str;
    Vector3 pose_rpy = trans.getRotation().asRPY();
    ok = ok && vectorToString(pose_rpy, pose_rpy_str);
    xmlNewProp(origin, BAD_CAST "xyz", BAD_CAST pose_xyz_str.c_str());
    xmlNewProp(origin, BAD_CAST "rpy", BAD_CAST pose_rpy_str.c_str());
    return ok;
}